

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

int Saig_ManDemiterSimpleDiff_old(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  void *pvVar1;
  ulong uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Man_t **ppAVar4;
  Aig_Man_t **ppAVar5;
  uint uVar6;
  int iVar7;
  Vec_Ptr_t *vSet;
  void **ppvVar8;
  Vec_Ptr_t *vSet_00;
  Aig_Man_t *pAVar9;
  ulong uVar10;
  ulong uVar11;
  Aig_Obj_t *pAVar12;
  char *pcVar13;
  long lVar14;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pObj1;
  int local_8c;
  int local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  Aig_Obj_t *local_60;
  long local_58;
  long local_50;
  Aig_Obj_t *local_48;
  Aig_Man_t **local_40;
  Aig_Man_t **local_38;
  
  uVar6 = p->nTruePos;
  local_38 = ppAig1;
  vSet = (Vec_Ptr_t *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar6 - 1) {
    uVar10 = (ulong)uVar6;
  }
  vSet->nSize = 0;
  iVar7 = (int)uVar10;
  vSet->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar7 * 8);
  }
  vSet->pArray = ppvVar8;
  local_40 = ppAig0;
  vSet_00 = (Vec_Ptr_t *)malloc(0x10);
  vSet_00->nSize = 0;
  vSet_00->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar7 << 3);
  }
  vSet_00->pArray = ppvVar8;
  if (0 < (int)uVar6) {
    local_8c = 0;
    local_7c = 0;
    uVar11 = 0;
    local_78 = uVar10;
    local_70 = uVar10;
    local_68 = uVar10;
    do {
      if ((long)p->vCos->nSize <= (long)uVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vCos->pArray[uVar11];
      uVar2 = *(ulong *)((long)pvVar1 + 8);
      pAVar12 = (Aig_Obj_t *)(uVar2 & 0xfffffffffffffffe);
      uVar6 = (uint)*(undefined8 *)&pAVar12->field_0x18;
      if ((uVar6 & 7) == 1) {
        if ((uVar2 & 1) == 0) {
          pcVar13 = "The output number %d of the miter is constant 1.\n";
LAB_006622fd:
          printf(pcVar13,uVar11 & 0xffffffff);
        }
      }
      else {
        if (((uVar6 & 7) - 7 < 0xfffffffe) ||
           (iVar7 = Aig_ObjRecognizeExor(pAVar12,&local_60,&local_48), pAVar12 = local_48,
           iVar7 == 0)) {
          pcVar13 = "The output number %d cannot be demitered.\n";
          goto LAB_006622fd;
        }
        if ((*(byte *)((long)pvVar1 + 8) & 1) != 0) {
          local_60 = (Aig_Obj_t *)((ulong)local_60 ^ 1);
        }
        pAVar3 = local_60;
        lVar14 = (long)local_7c;
        local_50 = (long)local_8c;
        if (*(int *)(((ulong)local_60 & 0xfffffffffffffffe) + 0x24) <
            *(int *)(((ulong)local_48 & 0xfffffffffffffffe) + 0x24)) {
          iVar7 = (int)local_78;
          if (local_7c == iVar7) {
            if (iVar7 < 0x10) {
              if (vSet->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(vSet->pArray,0x80);
              }
              vSet->pArray = ppvVar8;
              vSet->nCap = 0x10;
              local_78 = 0x10;
            }
            else {
              local_78 = (ulong)(uint)(iVar7 * 2);
              if (vSet->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(local_78 * 8);
              }
              else {
                ppvVar8 = (void **)realloc(vSet->pArray,local_78 * 8);
              }
              vSet->pArray = ppvVar8;
              vSet->nCap = iVar7 * 2;
            }
          }
          else {
            ppvVar8 = vSet->pArray;
          }
          pAVar12 = local_48;
          local_7c = local_7c + 1;
          vSet->nSize = local_7c;
          ppvVar8[lVar14] = pAVar3;
          iVar7 = (int)uVar10;
          if (local_8c == iVar7) {
            if (iVar7 < 0x10) {
              if (vSet_00->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(vSet_00->pArray,0x80);
              }
              vSet_00->pArray = ppvVar8;
              vSet_00->nCap = 0x10;
              uVar10 = 0x10;
            }
            else {
              uVar10 = (ulong)(uint)(iVar7 * 2);
              if (vSet_00->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(uVar10 * 8);
              }
              else {
                ppvVar8 = (void **)realloc(vSet_00->pArray,uVar10 * 8);
              }
              vSet_00->pArray = ppvVar8;
              vSet_00->nCap = iVar7 * 2;
            }
          }
          else {
            ppvVar8 = vSet_00->pArray;
          }
          local_8c = local_8c + 1;
          vSet_00->nSize = local_8c;
          ppvVar8[local_50] = pAVar12;
          local_70 = local_78;
          local_68 = uVar10;
        }
        else {
          iVar7 = (int)local_70;
          if (local_7c == iVar7) {
            local_58 = lVar14;
            if (iVar7 < 0x10) {
              if (vSet->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(vSet->pArray,0x80);
              }
              vSet->pArray = ppvVar8;
              vSet->nCap = 0x10;
              local_70 = 0x10;
              lVar14 = local_58;
              local_78 = local_70;
            }
            else {
              local_78 = (ulong)(uint)(iVar7 * 2);
              if (vSet->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(local_78 * 8);
              }
              else {
                ppvVar8 = (void **)realloc(vSet->pArray,local_78 * 8);
              }
              vSet->pArray = ppvVar8;
              vSet->nCap = iVar7 * 2;
              lVar14 = local_58;
              local_70 = local_78;
            }
          }
          else {
            ppvVar8 = vSet->pArray;
          }
          pAVar3 = local_60;
          local_7c = local_7c + 1;
          vSet->nSize = local_7c;
          ppvVar8[lVar14] = pAVar12;
          iVar7 = (int)local_68;
          if (local_8c == iVar7) {
            if (iVar7 < 0x10) {
              if (vSet_00->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(vSet_00->pArray,0x80);
              }
              vSet_00->pArray = ppvVar8;
              vSet_00->nCap = 0x10;
              uVar10 = 0x10;
              local_68 = 0x10;
            }
            else {
              uVar10 = (ulong)(uint)(iVar7 * 2);
              if (vSet_00->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(uVar10 * 8);
              }
              else {
                ppvVar8 = (void **)realloc(vSet_00->pArray,uVar10 * 8);
              }
              vSet_00->pArray = ppvVar8;
              vSet_00->nCap = iVar7 * 2;
              local_68 = uVar10;
            }
          }
          else {
            ppvVar8 = vSet_00->pArray;
          }
          local_8c = local_8c + 1;
          vSet_00->nSize = local_8c;
          ppvVar8[local_50] = pAVar3;
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->nTruePos);
  }
  ppAVar5 = local_38;
  ppAVar4 = local_40;
  if (local_40 != (Aig_Man_t **)0x0) {
    pAVar9 = Aig_ManDupNodesAll(p,vSet);
    *ppAVar4 = pAVar9;
    if (pAVar9->pName != (char *)0x0) {
      free(pAVar9->pName);
      (*ppAVar4)->pName = (char *)0x0;
      pAVar9 = *ppAVar4;
    }
    pcVar13 = (char *)malloc(6);
    builtin_strncpy(pcVar13,"part0",6);
    pAVar9->pName = pcVar13;
  }
  if (ppAVar5 != (Aig_Man_t **)0x0) {
    pAVar9 = Aig_ManDupNodesAll(p,vSet_00);
    *ppAVar5 = pAVar9;
    if (pAVar9->pName != (char *)0x0) {
      free(pAVar9->pName);
      (*ppAVar5)->pName = (char *)0x0;
      pAVar9 = *ppAVar5;
    }
    pcVar13 = (char *)malloc(6);
    builtin_strncpy(pcVar13,"part1",6);
    pAVar9->pName = pcVar13;
  }
  if (vSet->pArray != (void **)0x0) {
    free(vSet->pArray);
  }
  free(vSet);
  if (vSet_00->pArray != (void **)0x0) {
    free(vSet_00->pArray);
  }
  free(vSet_00);
  return 1;
}

Assistant:

int Saig_ManDemiterSimpleDiff_old( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pFanin, * pObj0, * pObj1;
    int i, Counter = 0;
//    assert( Saig_ManRegNum(p) % 2 == 0 );
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1( pFanin ) )
        {
            if ( !Aig_ObjFaninC0(pObj) )
                printf( "The output number %d of the miter is constant 1.\n", i );
            Counter++;
            continue;
        } 
        if ( !Aig_ObjIsNode(pFanin) || !Aig_ObjRecognizeExor( pFanin, &pObj0, &pObj1 ) )
        {
/*
            printf( "The miter cannot be demitered.\n" );
            Vec_PtrFree( vSet0 );
            Vec_PtrFree( vSet1 );
            return 0;
*/
            printf( "The output number %d cannot be demitered.\n", i );
            continue;
        }
        if ( Aig_ObjFaninC0(pObj) )
            pObj0 = Aig_Not(pObj0);

//        printf( "%d %d  ", Aig_Regular(pObj0)->Id, Aig_Regular(pObj1)->Id );
        if ( Aig_Regular(pObj0)->Id < Aig_Regular(pObj1)->Id )
        {
            Vec_PtrPush( vSet0, pObj0 );
            Vec_PtrPush( vSet1, pObj1 );
        }
        else
        {
            Vec_PtrPush( vSet0, pObj1 );
            Vec_PtrPush( vSet1, pObj0 );
        }
    }
//    printf( "Miter has %d constant outputs.\n", Counter );
//    printf( "\n" );
    if ( ppAig0 )
    {
        *ppAig0 = Aig_ManDupNodesAll( p, vSet0 );
        ABC_FREE( (*ppAig0)->pName );
        (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    }
    if ( ppAig1 )
    {
        *ppAig1 = Aig_ManDupNodesAll( p, vSet1 );
        ABC_FREE( (*ppAig1)->pName );
        (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    }
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    return 1;
}